

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

bool clip_image_batch_encode
               (clip_ctx *ctx,int n_threads,clip_image_f32_batch *imgs_c_ptr,float *vec)

{
  __uniq_ptr_data<clip_image_f32,_clip_image_f32_deleter,_true,_true> _Var1;
  pointer puVar2;
  long lVar3;
  ggml_tensor *pgVar4;
  int i;
  int iVar5;
  ulong uVar6;
  ggml_cgraph *pgVar7;
  size_type sVar8;
  size_t sVar9;
  void *pvVar10;
  undefined8 uVar11;
  int iVar12;
  pointer pfVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong __n;
  uint uVar17;
  uint uVar18;
  long lVar19;
  pointer pfVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  void *pvVar24;
  undefined8 uVar25;
  ulong uVar26;
  int w_1;
  int iVar27;
  int dy;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  pointer pfVar31;
  double dVar32;
  initializer_list<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
  __l;
  undefined1 auVar33 [16];
  long local_2180;
  uint local_216c;
  allocator_type local_2163;
  allocator_type local_2162;
  allocator_type local_2161;
  pointer local_2160;
  pointer local_2158;
  ulong local_2150;
  long local_2148;
  int local_2140;
  int local_213c;
  ulong local_2138;
  pointer local_2130;
  undefined8 local_2128;
  ulong local_2120;
  float *local_2118;
  ulong local_2110;
  long local_2108;
  long local_2100;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  pos_embed_t;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  grid_2d;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  grid;
  vector<float,_std::allocator<float>_> grid_w;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_2098;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  pos_embed_3d;
  vector<float,_std::allocator<float>_> grid_h;
  _Vector_base<float,_std::allocator<float>_> local_2050;
  vector<float,_std::allocator<float>_> inp_data;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_2020 [169];
  int bucket_coords_w [1024];
  
  if (ctx->has_vision_encoder == false) {
    if (4 < (int)g_logger_state.verbosity_thold) {
      return false;
    }
    clip_log_internal(GGML_LOG_LEVEL_ERROR,"%s: This gguf file seems to have no vision encoder\n",
                      "clip_image_batch_encode");
    return false;
  }
  uVar6 = (ulong)((long)(imgs_c_ptr->entries).
                        super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(imgs_c_ptr->entries).
                       super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar12 = (int)uVar6;
  if ((iVar12 != 1) && (ctx->has_llava_projector != false)) {
LAB_00125077:
    uVar25 = 0xae3;
LAB_001250c9:
    uVar25 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                        ,uVar25,"GGML_ASSERT(%s) failed","batch_size == 1");
    _Unwind_Resume(uVar25);
  }
  if ((iVar12 != 1) && (ctx->has_minicpmv_projector != false)) {
    uVar25 = 0xae6;
    goto LAB_001250c9;
  }
  local_2140 = n_threads;
  local_2118 = vec;
  if ((iVar12 != 1) && (ctx->has_glm_projector != false)) {
    uVar25 = 0xae9;
    goto LAB_001250c9;
  }
  ggml_backend_sched_reset
            ((ctx->sched)._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>
             ._M_t.super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
  pgVar7 = clip_image_build_graph(ctx,imgs_c_ptr,ctx->load_image_size,true);
  ggml_backend_sched_alloc_graph
            ((ctx->sched)._M_t.super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>
             ._M_t.super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
  if ((ctx->has_minicpmv_projector == false) && (ctx->has_qwen2vl_merger != true)) {
    uVar17 = (ctx->vision_model).hparams.image_size;
    uVar18 = uVar17;
    local_216c = uVar17;
    if (ctx->proj_type == PROJECTOR_TYPE_PIXTRAL) goto LAB_001243b6;
  }
  else {
    local_216c = (ctx->vision_model).hparams.image_size;
LAB_001243b6:
    _Var1.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
    super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
    super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl =
         (((imgs_c_ptr->entries).
           super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>;
    uVar17 = *(uint *)_Var1.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
                      super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
                      super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl;
    uVar18 = *(uint *)((long)_Var1.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>.
                             _M_t.super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
                             super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl + 4);
  }
  iVar21 = (ctx->vision_model).hparams.patch_size;
  iVar5 = (int)uVar17 / iVar21;
  local_213c = (int)uVar18 / iVar21;
  local_2138 = (ulong)(uint)(local_213c * iVar5);
  local_2110 = (ulong)((local_213c * iVar5 + 1U) -
                      (uint)((ctx->vision_model).class_embedding == (ggml_tensor *)0x0));
  local_2150 = (long)(ctx->load_image_size).width / (long)iVar21 & 0xffffffff;
  lVar14 = (long)(ctx->load_image_size).height;
  local_2120 = lVar14 / (long)iVar21 & 0xffffffff;
  local_2128 = ggml_graph_get_tensor(pgVar7,"inp_raw",lVar14 % (long)iVar21 & 0xffffffff);
  sVar8 = ggml_nelements(local_2128);
  std::vector<float,_std::allocator<float>_>::vector
            (&inp_data,sVar8,(allocator_type *)bucket_coords_w);
  uVar15 = local_2120;
  uVar25 = local_2128;
  local_2130 = inp_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
  puVar2 = (imgs_c_ptr->entries).
           super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2108 = (long)(imgs_c_ptr->entries).
                     super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3;
  local_2160 = (pointer)(uVar6 & 0xffffffff);
  if (iVar12 < 1) {
    local_2160 = (pointer)0x0;
  }
  for (lVar14 = 0; lVar14 != local_2108; lVar14 = lVar14 + 1) {
    _Var1.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
    super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
    super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl =
         puVar2[lVar14]._M_t.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>;
    uVar17 = *(uint *)_Var1.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>._M_t.
                      super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
                      super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl;
    uVar18 = *(uint *)((long)_Var1.super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter>.
                             _M_t.super__Tuple_impl<0UL,_clip_image_f32_*,_clip_image_f32_deleter>.
                             super__Head_base<0UL,_clip_image_f32_*,_false>._M_head_impl + 4);
    local_2100 = lVar14;
    if ((((ctx->has_glm_projector != false) || (ctx->has_llava_projector != false)) ||
        (ctx->proj_type - PROJECTOR_TYPE_GEMMA3 < 2)) &&
       ((uVar17 != local_216c || (uVar18 != local_216c)))) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                 ,0xb1f,"GGML_ASSERT(%s) failed","nx == image_size && ny == image_size");
      goto LAB_00125077;
    }
    iVar12 = uVar18 * uVar17;
    uVar6 = 0;
    if (0 < (int)uVar17) {
      uVar6 = (ulong)uVar17;
    }
    if ((int)uVar18 < 1) {
      uVar18 = 0;
    }
    local_2148 = (long)(iVar12 * 3) * 4;
    pfVar20 = inp_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (pfVar13 = (pointer)0x0; pfVar31 = pfVar20, pfVar13 != local_2160;
        pfVar13 = (pointer)((long)pfVar13 + 1)) {
      lVar19 = 8;
      pfVar20 = pfVar31;
      for (uVar26 = 0; uVar26 != uVar18; uVar26 = uVar26 + 1) {
        lVar22 = lVar19;
        for (uVar29 = 0; uVar6 != uVar29; uVar29 = uVar29 + 1) {
          lVar3 = *(long *)((long)puVar2[(long)pfVar13]._M_t.
                                  super___uniq_ptr_impl<clip_image_f32,_clip_image_f32_deleter> + 8)
          ;
          pfVar20[uVar29] = *(float *)(lVar3 + -8 + lVar22);
          pfVar20[(long)iVar12 + uVar29] = *(float *)(lVar3 + -4 + lVar22);
          pfVar20[(long)(iVar12 * 2) + uVar29] = *(float *)(lVar3 + lVar22);
          lVar22 = lVar22 + 0xc;
        }
        lVar19 = lVar19 + (long)(int)uVar17 * 0xc;
        pfVar20 = pfVar20 + (int)uVar17;
      }
      pfVar20 = pfVar31 + iVar12 * 3;
      local_2158 = pfVar31;
    }
  }
  ggml_nbytes(local_2128);
  ggml_backend_tensor_set(uVar25,local_2130,0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&inp_data.super__Vector_base<float,_std::allocator<float>_>);
  if (ctx->has_minicpmv_projector == true) {
    uVar25 = ggml_graph_get_tensor(pgVar7,"positions");
    sVar9 = ggml_nbytes(uVar25);
    pvVar10 = malloc(sVar9);
    iVar12 = (int)uVar15;
    uVar6 = 0;
    uVar26 = 0;
    if (0 < iVar12) {
      uVar26 = uVar15 & 0xffffffff;
    }
    for (; uVar26 != uVar6; uVar6 = uVar6 + 1) {
      dVar32 = floor(((double)(int)uVar6 * 70.0) / (double)iVar12);
      *(int *)((long)&local_2020[-1].
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar6 * 4) = (int)dVar32;
    }
    iVar21 = (int)local_2150;
    pfVar13 = (pointer)0x0;
    pfVar20 = (pointer)0x0;
    if (0 < iVar21) {
      pfVar20 = (pointer)(local_2150 & 0xffffffff);
    }
    for (; pfVar20 != pfVar13; pfVar13 = (pointer)((long)pfVar13 + 1)) {
      dVar32 = floor(((double)(int)pfVar13 * 70.0) / (double)iVar21);
      bucket_coords_w[(long)pfVar13] = (int)dVar32;
    }
    lVar14 = 0;
    for (uVar6 = 0; uVar6 != uVar26; uVar6 = uVar6 + 1) {
      for (pfVar13 = (pointer)0x0; pfVar20 != pfVar13; pfVar13 = (pointer)((long)pfVar13 + 1)) {
        *(int *)((long)pvVar10 + (long)pfVar13 * 4 + (long)(int)lVar14 * 4) =
             *(int *)((long)&local_2020[-1].
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar6 * 4) * 0x46 +
             bucket_coords_w[(long)pfVar13];
      }
      lVar14 = (long)(int)lVar14 + (long)pfVar13;
    }
    local_2160 = pfVar20;
    ggml_nbytes(uVar25);
    ggml_backend_tensor_set(uVar25,pvVar10,0);
    free(pvVar10);
    local_2148 = ggml_graph_get_tensor(pgVar7,"pos_embed");
    uVar6 = local_2150;
    iVar21 = ctx->minicpmv_version;
    sVar8 = (size_type)(int)local_2150;
    std::vector<float,_std::allocator<float>_>::vector(&grid_h,sVar8,(allocator_type *)&inp_data);
    std::vector<float,_std::allocator<float>_>::vector
              (&grid_w,(long)iVar12,(allocator_type *)&inp_data);
    pfVar20 = local_2160;
    uVar17 = (uint)(1 < iVar21 - 3U) * 0x200 + 0xe00;
    local_2158 = (pointer)(uVar15 & 0xffffffff);
    for (pfVar13 = (pointer)0x0; local_2160 != pfVar13; pfVar13 = (pointer)((long)pfVar13 + 1)) {
      grid_h.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)pfVar13] = (float)(int)pfVar13;
    }
    for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
      grid_w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar15] = (float)(int)uVar15;
    }
    std::vector<float,_std::allocator<float>_>::vector
              (&inp_data,(long)iVar12,(allocator_type *)bucket_coords_w);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector(&grid,sVar8,&inp_data,(allocator_type *)&local_2098);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&inp_data.super__Vector_base<float,_std::allocator<float>_>);
    for (pfVar13 = (pointer)0x0; pfVar13 != pfVar20; pfVar13 = (pointer)((long)pfVar13 + 1)) {
      for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
        grid.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)pfVar13].
        super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
        [uVar15] = grid_w.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15];
      }
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)&inp_data,&grid);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector(local_2020,&grid);
    __l._M_len = 2;
    __l._M_array = (iterator)&inp_data;
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::vector(&grid_2d,__l,(allocator_type *)bucket_coords_w);
    lVar14 = 0x18;
    do {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 *)((long)&local_2020[-1].
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar14));
      lVar14 = lVar14 + -0x18;
    } while (lVar14 != -0x18);
    for (pfVar13 = (pointer)0x0; pfVar13 != pfVar20; pfVar13 = (pointer)((long)pfVar13 + 1)) {
      for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
        *(float *)(*(long *)&((grid_2d.
                               super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[(long)pfVar13].
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data + uVar15 * 4) =
             grid_h.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[(long)pfVar13];
        *(float *)(*(long *)&grid_2d.
                             super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)pfVar13].
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data + uVar15 * 4) =
             grid_w.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15];
      }
    }
    uVar18 = uVar17 >> 1;
    get_1d_sincos_pos_embed_from_grid_new
              ((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                *)&inp_data,uVar18,
               grid_2d.
               super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    get_1d_sincos_pos_embed_from_grid_new
              ((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                *)bucket_coords_w,uVar18,
               grid_2d.
               super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    uVar29 = ((long)inp_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)inp_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x18;
    uVar15 = (*(long *)(inp_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + 2) -
             *(long *)inp_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18;
    __n = (ulong)uVar17;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_2050,__n,&local_2161);
    iVar12 = (int)uVar15;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector(&local_2098,(long)iVar12,(value_type *)&local_2050,&local_2162);
    iVar21 = (int)uVar29;
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::vector(&pos_embed_3d,(long)iVar21,&local_2098,&local_2163);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&local_2098);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_2050);
    uVar16 = 0;
    uVar15 = uVar15 & 0xffffffff;
    if (iVar12 < 1) {
      uVar15 = uVar16;
    }
    uVar29 = uVar29 & 0xffffffff;
    if (iVar21 < 1) {
      uVar29 = uVar16;
    }
    for (; uVar16 != uVar29; uVar16 = uVar16 + 1) {
      for (uVar23 = 0; uVar23 != uVar15; uVar23 = uVar23 + 1) {
        lVar14 = *(long *)(*(long *)(inp_data.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + uVar16 * 6) +
                          uVar23 * 0x18);
        lVar19 = *(long *)&pos_embed_3d.
                           super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16].
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar23].
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data;
        lVar22 = *(long *)(*(long *)(bucket_coords_w._0_8_ + uVar16 * 0x18) + uVar23 * 0x18);
        for (uVar28 = 0; uVar18 != uVar28; uVar28 = uVar28 + 1) {
          *(undefined4 *)(lVar19 + uVar28 * 4) = *(undefined4 *)(lVar14 + uVar28 * 4);
          *(undefined4 *)(lVar19 + (ulong)(uVar18 << 2) + uVar28 * 4) =
               *(undefined4 *)(lVar22 + uVar28 * 4);
        }
      }
    }
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               *)bucket_coords_w);
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               *)&inp_data);
    std::vector<float,_std::allocator<float>_>::vector
              (&inp_data,__n,(allocator_type *)bucket_coords_w);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector(&pos_embed_t,(long)((uVar6 << 0x20) * (long)local_2158) >> 0x20,&inp_data,
             (allocator_type *)&local_2098);
    uVar6 = local_2150;
    pfVar20 = local_2160;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&inp_data.super__Vector_base<float,_std::allocator<float>_>);
    local_2180 = 0;
    pfVar13 = (pointer)0x0;
    while (pfVar13 != pfVar20) {
      lVar14 = local_2180;
      local_2158 = pfVar13;
      for (lVar19 = 0; uVar26 * 0x18 - lVar19 != 0; lVar19 = lVar19 + 0x18) {
        std::vector<float,_std::allocator<float>_>::operator=
                  ((vector<float,_std::allocator<float>_> *)
                   ((long)&((pos_embed_t.
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar14),
                   (vector<float,_std::allocator<float>_> *)
                   ((long)&((pos_embed_3d.
                             super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)pfVar13].
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data + lVar19));
        lVar14 = lVar14 + sVar8 * 0x18;
      }
      local_2180 = local_2180 + 0x18;
      uVar6 = local_2150;
      pfVar20 = local_2160;
      pfVar13 = (pointer)((long)local_2158 + 1);
    }
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::~vector(&pos_embed_3d);
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::~vector(&grid_2d);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&grid);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&grid_w.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&grid_h.super__Vector_base<float,_std::allocator<float>_>);
    lVar14 = local_2148;
    sVar9 = ggml_nbytes(local_2148);
    pvVar10 = malloc(sVar9);
    uVar18 = (int)local_2120 * (int)uVar6;
    uVar15 = 0;
    uVar6 = (ulong)uVar18;
    if ((int)uVar18 < 1) {
      uVar6 = uVar15;
    }
    pvVar24 = pvVar10;
    for (; uVar15 != uVar6; uVar15 = uVar15 + 1) {
      pfVar20 = pos_embed_t.
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start;
      for (uVar26 = 0; __n != uVar26; uVar26 = uVar26 + 1) {
        *(float *)((long)pvVar24 + uVar26 * 4) = pfVar20[uVar26];
      }
      pvVar24 = (void *)((long)pvVar24 + (ulong)(uVar17 * 4));
    }
    uVar25 = ggml_nbytes(lVar14);
    ggml_backend_tensor_set(lVar14,pvVar10,0,uVar25);
    free(pvVar10);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&pos_embed_t);
    goto LAB_00124e50;
  }
  if ((ctx->vision_model).class_embedding != (ggml_tensor *)0x0) {
    uVar25 = ggml_graph_get_tensor(pgVar7);
    sVar9 = ggml_nbytes(uVar25);
    pvVar10 = malloc(sVar9);
    sVar9 = ggml_nbytes(uVar25);
    memset(pvVar10,0,sVar9);
    uVar11 = ggml_nbytes(uVar25);
    ggml_backend_tensor_set(uVar25,pvVar10,0,uVar11);
    free(pvVar10);
  }
  uVar6 = local_2110;
  if (ctx->has_qwen2vl_merger == true) {
    uVar25 = ggml_graph_get_tensor(pgVar7,"positions");
    sVar9 = ggml_nbytes(uVar25);
    pvVar10 = malloc(sVar9);
    iVar12 = (int)local_2138;
    iVar21 = 0;
    for (uVar17 = 0; (int)uVar17 < local_213c; uVar17 = uVar17 + 2) {
      for (iVar27 = 0; iVar27 < iVar5; iVar27 = iVar27 + 2) {
        for (uVar18 = 0; uVar18 != 2; uVar18 = uVar18 + 1) {
          lVar14 = (long)iVar21;
          for (lVar19 = 0; (int)lVar19 != 2; lVar19 = lVar19 + 1) {
            *(uint *)((long)pvVar10 + lVar19 * 4 + lVar14 * 4) = uVar18 | uVar17;
            iVar30 = iVar27 + (int)lVar19;
            *(int *)((long)pvVar10 + lVar19 * 4 + lVar14 * 4 + (long)iVar12 * 4) = iVar30;
            *(uint *)((long)pvVar10 + lVar19 * 4 + lVar14 * 4 + (long)(iVar12 * 2) * 4) =
                 uVar18 | uVar17;
            *(int *)((long)pvVar10 + lVar19 * 4 + lVar14 * 4 + (long)(iVar12 * 3) * 4) = iVar30;
          }
          iVar21 = iVar21 + 2;
        }
      }
    }
    uVar11 = ggml_nbytes(uVar25);
    ggml_backend_tensor_set(uVar25,pvVar10,0,uVar11);
  }
  else {
    if (ctx->proj_type - PROJECTOR_TYPE_GEMMA3 < 2) goto LAB_00124e50;
    iVar12 = (int)local_2110;
    if (ctx->proj_type == PROJECTOR_TYPE_PIXTRAL) {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&inp_data,(long)iVar12,
                 (allocator_type *)bucket_coords_w);
      auVar33 = ggml_graph_get_tensor(pgVar7,"pos_h");
      pfVar20 = inp_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar26 = auVar33._8_8_;
      uVar15 = 0;
      uVar6 = uVar6 & 0xffffffff;
      if (iVar12 < 1) {
        uVar6 = uVar15;
      }
      for (; uVar6 != uVar15; uVar15 = uVar15 + 1) {
        uVar29 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
        uVar26 = (long)uVar29 % (long)iVar5 & 0xffffffff;
        inp_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar15] = (float)((long)uVar29 / (long)iVar5);
      }
      ggml_nbytes(auVar33._0_8_,
                  inp_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start,uVar26);
      ggml_backend_tensor_set(auVar33._0_8_,pfVar20,0);
      uVar25 = ggml_graph_get_tensor(pgVar7,"pos_w");
      for (uVar15 = 0; uVar6 != uVar15; uVar15 = uVar15 + 1) {
        inp_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar15] =
             (float)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) %
                    (long)iVar5);
      }
      uVar11 = ggml_nbytes(uVar25);
      ggml_backend_tensor_set
                (uVar25,inp_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,0,uVar11);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&inp_data);
      goto LAB_00124e50;
    }
    uVar25 = ggml_graph_get_tensor(pgVar7,"positions");
    sVar9 = ggml_nbytes(uVar25);
    pvVar10 = malloc(sVar9);
    uVar15 = 0;
    uVar6 = uVar6 & 0xffffffff;
    if (iVar12 < 1) {
      uVar6 = uVar15;
    }
    for (; uVar6 != uVar15; uVar15 = uVar15 + 1) {
      *(int *)((long)pvVar10 + uVar15 * 4) = (int)uVar15;
    }
    uVar11 = ggml_nbytes(uVar25);
    uVar6 = 0;
    ggml_backend_tensor_set(uVar25,pvVar10,0,uVar11);
    free(pvVar10);
    if (ctx->has_glm_projector != false) goto LAB_00124e50;
    uVar25 = ggml_graph_get_tensor(pgVar7,"patches");
    pgVar4 = (ctx->vision_model).class_embedding;
    sVar9 = ggml_nbytes(uVar25);
    pvVar10 = malloc(sVar9);
    uVar15 = local_2138 & 0xffffffff;
    if ((int)local_2138 < 1) {
      uVar15 = uVar6;
    }
    for (; uVar15 != uVar6; uVar6 = uVar6 + 1) {
      *(uint *)((long)pvVar10 + uVar6 * 4) = (uint)(pgVar4 != (ggml_tensor *)0x0) + (int)uVar6;
    }
    uVar11 = ggml_nbytes(uVar25);
    ggml_backend_tensor_set(uVar25,pvVar10,0,uVar11);
  }
  free(pvVar10);
LAB_00124e50:
  ggml_backend_cpu_set_n_threads(ctx->backend_cpu,local_2140);
  uVar17 = ggml_backend_sched_graph_compute
                     ((ctx->sched)._M_t.
                      super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                      super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                      super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,pgVar7);
  if (uVar17 == 0) {
    uVar25 = ggml_graph_node(pgVar7,0xffffffffffffffff);
    uVar11 = ggml_nbytes(uVar25);
    ggml_backend_tensor_get(uVar25,local_2118,0,uVar11);
    return true;
  }
  if (4 < (int)g_logger_state.verbosity_thold) {
    return false;
  }
  clip_log_internal(GGML_LOG_LEVEL_ERROR,
                    "%s: ggml_backend_sched_graph_compute failed with error %d\n",
                    "clip_image_batch_encode",(ulong)uVar17);
  return false;
}

Assistant:

bool clip_image_batch_encode(clip_ctx * ctx, const int n_threads, const clip_image_f32_batch * imgs_c_ptr, float * vec) {
    const clip_image_f32_batch & imgs = *imgs_c_ptr;

    if (!ctx->has_vision_encoder) {
        LOG_ERR("%s: This gguf file seems to have no vision encoder\n", __func__);
        return false;
    }

    int batch_size = imgs.entries.size();
    if (ctx->has_llava_projector) {
        GGML_ASSERT(batch_size == 1); // TODO: support multiple images
    }
    if (ctx->has_minicpmv_projector) {
        GGML_ASSERT(batch_size == 1);
    }
    if (ctx->has_glm_projector) {
        GGML_ASSERT(batch_size == 1);
    }

    // build the inference graph
    ggml_backend_sched_reset(ctx->sched.get());
    ggml_cgraph * gf = clip_image_build_graph(ctx, imgs, ctx->load_image_size, true);
    ggml_backend_sched_alloc_graph(ctx->sched.get(), gf);

    // set inputs
    const auto & model = ctx->vision_model;
    const auto & hparams = model.hparams;

    // TODO @ngxson : this is ugly, need to refactor later
    bool support_dynamic_size = ctx->has_minicpmv_projector
        || ctx->has_qwen2vl_merger
        || ctx->proj_type == PROJECTOR_TYPE_PIXTRAL;

    const int image_size = hparams.image_size;
    int image_size_width  = image_size;
    int image_size_height = image_size;
    if (support_dynamic_size) {
        image_size_width  = imgs.entries[0]->nx;
        image_size_height = imgs.entries[0]->ny;
    }
    const int patch_size    = hparams.patch_size;
    const int num_patches   = ((image_size_width / patch_size) * (image_size_height / patch_size));
    const int num_positions = num_patches + (model.class_embedding ? 1 : 0);
    const int pos_w = ctx->load_image_size.width / patch_size;
    const int pos_h = ctx->load_image_size.height / patch_size;

    {
        struct ggml_tensor * inp_raw = ggml_graph_get_tensor(gf, "inp_raw");
        std::vector<float> inp_data(ggml_nelements(inp_raw));
        float * data = inp_data.data();

        // layout of data (note: the channel dim is unrolled to better visualize the layout):
        //
        // ┌──W──┐
        // │     H │  channel = R
        // ├─────┤ │
        // │     H │  channel = G
        // ├─────┤ │
        // │     H │  channel = B
        // └─────┘ │
        //   ──────┘ x B

        for (size_t i = 0; i < imgs.entries.size(); i++) {
            const int nx = imgs.entries[i]->nx;
            const int ny = imgs.entries[i]->ny;

            if (ctx->has_glm_projector
                    || ctx->has_llava_projector
                    || ctx->proj_type == PROJECTOR_TYPE_GEMMA3
                    || ctx->proj_type == PROJECTOR_TYPE_IDEFICS3) {
                GGML_ASSERT(nx == image_size && ny == image_size);
            }

            const int n = nx * ny;

            for (int b = 0; b < batch_size; b++) {
                float * batch_entry = data + b * (3*n);
                for (int y = 0; y < ny; y++) {
                    for (int x = 0; x < nx; x++) {
                        size_t base_src = 3*(y * nx + x); // idx of the first channel
                        size_t base_dst =    y * nx + x;  // idx of the first channel
                        batch_entry[      base_dst] = imgs.entries[b]->buf[base_src    ];
                        batch_entry[1*n + base_dst] = imgs.entries[b]->buf[base_src + 1];
                        batch_entry[2*n + base_dst] = imgs.entries[b]->buf[base_src + 2];
                    }
                }
            }
        }
        ggml_backend_tensor_set(inp_raw, data, 0, ggml_nbytes(inp_raw));
    }
    if (ctx->has_minicpmv_projector) {
        {
            // inspired from siglip:
            //    -> https://huggingface.co/HuggingFaceM4/siglip-so400m-14-980-flash-attn2-navit
            //    -> https://huggingface.co/HuggingFaceM4/siglip-so400m-14-980-flash-attn2-navit/blob/d66538faeba44480d0bfaa42145eef26f9423199/modeling_siglip.py#L316
            struct ggml_tensor * positions = ggml_graph_get_tensor(gf, "positions");
            int* positions_data = (int*)malloc(ggml_nbytes(positions));
            int bucket_coords_h[1024];
            int bucket_coords_w[1024];
            for (int i = 0; i < pos_h; i++){
                bucket_coords_h[i] = std::floor(70.0*i/pos_h);
            }
            for (int i = 0; i < pos_w; i++){
                bucket_coords_w[i] = std::floor(70.0*i/pos_w);
            }
            for (int i = 0, id = 0; i < pos_h; i++){
                for (int j = 0; j < pos_w; j++){
                    positions_data[id++] = bucket_coords_h[i]*70 + bucket_coords_w[j];
                }
            }
            ggml_backend_tensor_set(positions, positions_data, 0, ggml_nbytes(positions));
            free(positions_data);
        }

        {
            // inspired from resampler of Qwen-VL:
            //    -> https://huggingface.co/Qwen/Qwen-VL/tree/main
            //    -> https://huggingface.co/Qwen/Qwen-VL/blob/0547ed36a86561e2e42fecec8fd0c4f6953e33c4/visual.py#L23
            struct ggml_tensor * pos_embed = ggml_graph_get_tensor(gf, "pos_embed");
            int embed_dim = 4096;
            if (ctx->minicpmv_version == 2) {
                embed_dim = 4096;
            }
            else if (ctx->minicpmv_version == 3) {
                embed_dim = 3584;
            }
            else if (ctx->minicpmv_version == 4) {
                embed_dim = 3584;
            }
            auto pos_embed_t = get_2d_sincos_pos_embed(embed_dim, std::make_pair(pos_w, pos_h));

            float * pos_embed_data = (float *)malloc(ggml_nbytes(pos_embed));
            for(int i=0;i < pos_w * pos_h; ++i){
                for(int j=0; j < embed_dim; ++j){
                    pos_embed_data[i * embed_dim + j] = pos_embed_t[i][j];
                }
            }

            ggml_backend_tensor_set(pos_embed, pos_embed_data, 0, ggml_nbytes(pos_embed));
            free(pos_embed_data);
        }
    }
    else {
        if (model.class_embedding) {
            struct ggml_tensor * embeddings = ggml_graph_get_tensor(gf, "embeddings");

            void* zero_mem = malloc(ggml_nbytes(embeddings));
            memset(zero_mem, 0, ggml_nbytes(embeddings));
            ggml_backend_tensor_set(embeddings, zero_mem, 0, ggml_nbytes(embeddings));
            free(zero_mem);
        }

        if (ctx->has_qwen2vl_merger) {
            struct ggml_tensor * positions = ggml_graph_get_tensor(gf, "positions");

            const int pw = image_size_width / patch_size;
            const int ph = image_size_height / patch_size;
            int* positions_data = (int*)malloc(ggml_nbytes(positions));

            int ptr = 0;
            for (int y = 0; y < ph; y+=2)
            {
                for (int x = 0; x < pw; x+=2)
                {
                    for (int dy = 0; dy < 2; dy++) {
                        for (int dx = 0; dx < 2; dx++) {
                            positions_data[ptr]                 = y + dy;
                            positions_data[num_patches + ptr]     = x + dx;
                            positions_data[num_patches * 2 + ptr] = y + dy;
                            positions_data[num_patches * 3 + ptr] = x + dx;
                            ptr++;
                        }
                    }
                }
            }

            ggml_backend_tensor_set(positions, positions_data, 0, ggml_nbytes(positions));
            free(positions_data);
        }
        else if (ctx->proj_type == PROJECTOR_TYPE_GEMMA3) {
            // do nothing
        }
        else if (ctx->proj_type == PROJECTOR_TYPE_IDEFICS3) {
            // do nothing
        }
        else if (ctx->proj_type == PROJECTOR_TYPE_PIXTRAL) {
            // set the 2D positions
            int n_patches_per_col = image_size_width / patch_size;
            std::vector<int> pos_data(num_positions);
            struct ggml_tensor * pos;
            // dimension H
            pos = ggml_graph_get_tensor(gf, "pos_h");
            for (int i = 0; i < num_positions; i++) {
                pos_data[i] = i / n_patches_per_col;
            }
            ggml_backend_tensor_set(pos, pos_data.data(), 0, ggml_nbytes(pos));
            // dimension W
            pos = ggml_graph_get_tensor(gf, "pos_w");
            for (int i = 0; i < num_positions; i++) {
                pos_data[i] = i % n_patches_per_col;
            }
            ggml_backend_tensor_set(pos, pos_data.data(), 0, ggml_nbytes(pos));
        }
        else {
            struct ggml_tensor * positions = ggml_graph_get_tensor(gf, "positions");

            int* positions_data = (int*)malloc(ggml_nbytes(positions));
            for (int i = 0; i < num_positions; i++) {
                positions_data[i] = i;
            }
            ggml_backend_tensor_set(positions, positions_data, 0, ggml_nbytes(positions));
            free(positions_data);

            if (!ctx->has_glm_projector) {
                struct ggml_tensor * patches = ggml_graph_get_tensor(gf, "patches");
                // The patches vector is used to get rows to index into the embeds with;
                // we should skip dim 0 only if we have CLS to avoid going out of bounds
                // when retrieving the rows.
                int patch_offset = model.class_embedding ? 1 : 0;
                int* patches_data = (int*)malloc(ggml_nbytes(patches));
                for (int i = 0; i < num_patches; i++) {
                    patches_data[i] = i + patch_offset;
                }
                ggml_backend_tensor_set(patches, patches_data, 0, ggml_nbytes(patches));
                free(patches_data);
            }
        }
    }

    ggml_backend_cpu_set_n_threads(ctx->backend_cpu, n_threads);

    auto status = ggml_backend_sched_graph_compute(ctx->sched.get(), gf);
    if (status != GGML_STATUS_SUCCESS) {
        LOG_ERR("%s: ggml_backend_sched_graph_compute failed with error %d\n", __func__, status);
        return false;
    }

    // the last node is the embedding tensor
    struct ggml_tensor * embeddings = ggml_graph_node(gf, -1);

    // copy the embeddings to the location passed by the user
    ggml_backend_tensor_get(embeddings, vec, 0, ggml_nbytes(embeddings));

    return true;
}